

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

uint32_t lzma_index_checks(lzma_index *i)

{
  index_tree_node *piVar1;
  index_stream *s;
  uint32_t checks;
  lzma_index *i_local;
  
  s._4_4_ = i->checks;
  piVar1 = (i->streams).rightmost;
  if (*(int *)&piVar1[2].left != -1) {
    s._4_4_ = 1 << ((byte)(int)piVar1[3].uncompressed_base & 0x1f) | s._4_4_;
  }
  return s._4_4_;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_index_checks(const lzma_index *i)
{
	uint32_t checks = i->checks;

	// Get the type of the Check of the last Stream too.
	const index_stream *s = (const index_stream *)(i->streams.rightmost);
	if (s->stream_flags.version != UINT32_MAX)
		checks |= UINT32_C(1) << s->stream_flags.check;

	return checks;
}